

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cc
# Opt level: O0

void __thiscall iqnet::Connect_processor::handle_output(Connect_processor *this,bool *terminate)

{
  network_error *this_00;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  bool *pbStack_18;
  int err;
  bool *terminate_local;
  Connect_processor *this_local;
  
  *terminate = true;
  pbStack_18 = terminate;
  terminate_local = (bool *)this;
  local_1c = Socket::get_last_error(&this->sock);
  if ((local_1c != 0) && (local_1c != 0x73)) {
    Socket::close(&this->sock,(int)terminate);
    this_00 = (network_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Connector",&local_41);
    network_error::network_error(this_00,&local_40,true,local_1c);
    __cxa_throw(this_00,&network_error::typeinfo,network_error::~network_error);
  }
  return;
}

Assistant:

void handle_output( bool& terminate )
  {
    terminate = true;
    int err = sock.get_last_error();

    if (err && err != IQXMLRPC_INPROGRESS) {
      sock.close();
      throw network_error("Connector", true, err);
    }
  }